

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall
luna::SemanticAnalysisVisitor::Visit(SemanticAnalysisVisitor *this,Block *block,void *data)

{
  bool bVar1;
  pointer pSVar2;
  long in_RSI;
  __normal_iterator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_*,_std::vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>_>
  *in_RDI;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *stmt;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
  *__range1;
  vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_*,_std::vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>_>
  local_28;
  long local_20;
  
  local_20 = in_RSI + 8;
  local_28._M_current =
       (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
       std::
       vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  std::
  vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
  ::end(in_stack_ffffffffffffffb8);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_RDI,(__normal_iterator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_*,_std::vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>_>
                                    *)in_stack_ffffffffffffffb8), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_*,_std::vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>_>
    ::operator*(&local_28);
    pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                       ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                        0x1904e7);
    (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,0);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_*,_std::vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>_>
    ::operator++(&local_28);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x190513);
  if (bVar1) {
    pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                       ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                        0x190527);
    (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,0);
  }
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(Block *block, void *data)
    {
        for (auto &stmt : block->statements_)
            stmt->Accept(this, nullptr);
        if (block->return_stmt_)
            block->return_stmt_->Accept(this, nullptr);
    }